

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint addChunk_tEXt(ucvector *out,char *keyword,char *textstring)

{
  uchar *chunk_00;
  uint uVar1;
  size_t size;
  size_t size_00;
  uchar *chunk;
  
  chunk = (uchar *)0x0;
  size = lodepng_strlen(keyword);
  size_00 = lodepng_strlen(textstring);
  if (size - 0x50 < 0xffffffffffffffb1) {
    uVar1 = 0x59;
  }
  else {
    uVar1 = lodepng_chunk_init(&chunk,out,(int)size + (int)size_00 + 1,"tEXt");
    chunk_00 = chunk;
    if (uVar1 == 0) {
      lodepng_memcpy(chunk + 8,keyword,size);
      chunk_00[size + 8] = '\0';
      lodepng_memcpy(chunk_00 + size + 9,textstring,size_00);
      lodepng_chunk_generate_crc(chunk_00);
      uVar1 = 0;
    }
  }
  return uVar1;
}

Assistant:

static unsigned addChunk_tEXt(ucvector* out, const char* keyword, const char* textstring) {
  unsigned char* chunk = 0;
  size_t keysize = lodepng_strlen(keyword), textsize = lodepng_strlen(textstring);
  size_t size = keysize + 1 + textsize;
  if (keysize < 1 || keysize > 79) return 89; /*error: invalid keyword size*/
  CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, size, "tEXt"));
  lodepng_memcpy(chunk + 8, keyword, keysize);
  chunk[8 + keysize] = 0; /*null termination char*/
  lodepng_memcpy(chunk + 9 + keysize, textstring, textsize);
  lodepng_chunk_generate_crc(chunk);
  return 0;
}